

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O3

void __thiscall OpenMD::ifstrstream::~ifstrstream(ifstrstream *this)

{
  ~ifstrstream(this,&VTT);
  std::ios_base::~ios_base((ios_base *)&this->field_0x170);
  operator_delete(this,0x278);
  return;
}

Assistant:

ifstrstream::~ifstrstream() { close(); }